

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_get_psa_curve_info_from_tls_id(uint16_t tls_id,psa_key_type_t *type,size_t *bits)

{
  int local_24;
  int i;
  size_t *bits_local;
  psa_key_type_t *type_local;
  uint16_t tls_id_local;
  
  local_24 = 0;
  while( true ) {
    if (tls_id_match_table[local_24].tls_id == 0) {
      return -0x86;
    }
    if (tls_id_match_table[local_24].tls_id == tls_id) break;
    local_24 = local_24 + 1;
  }
  if (type != (psa_key_type_t *)0x0) {
    *type = tls_id_match_table[local_24].psa_family | 0x7100;
  }
  if (bits != (size_t *)0x0) {
    *bits = (ulong)tls_id_match_table[local_24].bits;
  }
  return 0;
}

Assistant:

int mbedtls_ssl_get_psa_curve_info_from_tls_id(uint16_t tls_id,
                                               psa_key_type_t *type,
                                               size_t *bits)
{
    for (int i = 0; tls_id_match_table[i].tls_id != 0; i++) {
        if (tls_id_match_table[i].tls_id == tls_id) {
            if (type != NULL) {
                *type = PSA_KEY_TYPE_ECC_KEY_PAIR(tls_id_match_table[i].psa_family);
            }
            if (bits != NULL) {
                *bits = tls_id_match_table[i].bits;
            }
            return PSA_SUCCESS;
        }
    }

    return PSA_ERROR_NOT_SUPPORTED;
}